

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_args.c
# Opt level: O0

REF_STATUS ref_args_char(REF_INT n,char **args,char *long_target,char *short_target,char **value)

{
  REF_STATUS RVar1;
  int local_34;
  char **ppcStack_30;
  REF_INT pos;
  char **value_local;
  char *short_target_local;
  char *long_target_local;
  char **args_local;
  REF_INT n_local;
  
  *value = (char *)0x0;
  ppcStack_30 = value;
  value_local = (char **)short_target;
  short_target_local = long_target;
  long_target_local = (char *)args;
  args_local._0_4_ = n;
  RVar1 = ref_args_find(n,args,long_target,&local_34);
  if (RVar1 == 0) {
    if (local_34 < (REF_INT)args_local + -1) {
      *ppcStack_30 = *(char **)(long_target_local + (long)(local_34 + 1) * 8);
      args_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_args.c",0x39,
             "ref_args_char","missing value");
      printf("for option %s",short_target_local);
      args_local._4_4_ = 1;
    }
  }
  else {
    RVar1 = ref_args_find((REF_INT)args_local,(char **)long_target_local,(char *)value_local,
                          &local_34);
    if (RVar1 == 0) {
      if (local_34 < (REF_INT)args_local + -1) {
        *ppcStack_30 = *(char **)(long_target_local + (long)(local_34 + 1) * 8);
        args_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_args.c",0x3f
               ,"ref_args_char","missing value");
        printf("for option %s",value_local);
        args_local._4_4_ = 1;
      }
    }
    else {
      args_local._4_4_ = 5;
    }
  }
  return args_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_args_char(REF_INT n, char **args,
                                 const char *long_target,
                                 const char *short_target, char **value) {
  REF_INT pos;
  *value = NULL;
  if (REF_SUCCESS == ref_args_find(n, args, long_target, &pos)) {
    RAB(pos < n - 1, "missing value",
        { printf("for option %s", long_target); });
    *value = args[pos + 1];
    return REF_SUCCESS;
  }
  if (REF_SUCCESS == ref_args_find(n, args, short_target, &pos)) {
    RAB(pos < n - 1, "missing value",
        { printf("for option %s", short_target); });
    *value = args[pos + 1];
    return REF_SUCCESS;
  }
  return REF_NOT_FOUND;
}